

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInput.cpp
# Opt level: O2

void __thiscall gr::GrBufferIStream::ReadBlockFromFont(GrBufferIStream *this,void *pvInput,int cb)

{
  undefined4 *puVar1;
  byte *__src;
  
  if (this->m_pbLim != (byte *)0x0) {
    if (-1 < cb) {
      __src = this->m_pbNext;
      if ((long)(ulong)(uint)cb <= (long)this->m_pbLim - (long)__src) goto LAB_0010867d;
    }
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0x80000001;
    __cxa_throw(puVar1,&GrResult::typeinfo,0);
  }
  __src = this->m_pbNext;
LAB_0010867d:
  if (cb != 0) {
    memmove(pvInput,__src,(long)cb);
    __src = this->m_pbNext;
  }
  this->m_pbNext = __src + cb;
  return;
}

Assistant:

void GrBufferIStream::ReadBlockFromFont(void * pvInput, int cb)
{
    if (m_pbLim && (cb < 0 || cb > m_pbLim - m_pbNext))
        THROW(kresReadFault);
	std::copy(m_pbNext, m_pbNext + cb, reinterpret_cast<byte*>(pvInput));
	m_pbNext += cb;
}